

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scaling.cpp
# Opt level: O2

void scale(Runtime *rt)

{
  pointer pdVar1;
  int iVar2;
  mapped_type_conflict1 *pmVar3;
  long lVar4;
  pointer piVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> factorpervar;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> maxabscoefpervar;
  uint local_bc;
  double local_b8;
  undefined8 uStack_b0;
  int local_9c;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_98;
  double local_68;
  undefined8 uStack_60;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_58;
  
  Instance::operator=(&rt->scaled,&rt->instance);
  scale_rows(rt);
  if ((rt->settings).varscaling == true) {
    local_58._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_58._M_impl.super__Rb_tree_header._M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl._0_4_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      iVar2 = (rt->scaled).num_var;
      if (iVar2 <= (int)local_98._M_impl._0_4_) break;
      pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_58,(key_type_conflict1 *)&local_98);
      *pmVar3 = 0.0;
      local_98._M_impl._0_4_ = local_98._M_impl._0_4_ + 1;
    }
    local_98._M_impl._0_4_ = 0;
    while ((int)local_98._M_impl._0_4_ < iVar2) {
      piVar5 = (rt->scaled).A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar9 = (long)piVar5[(int)local_98._M_impl._0_4_];
          lVar9 < piVar5[(long)(int)local_98._M_impl._0_4_ + 1]; lVar9 = lVar9 + 1) {
        local_b8 = (rt->scaled).A.mat.value.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar9];
        uStack_b0 = 0;
        pmVar3 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_58,(key_type_conflict1 *)&local_98);
        if (*pmVar3 <= ABS(local_b8) && ABS(local_b8) != *pmVar3) {
          local_b8 = (rt->scaled).A.mat.value.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar9];
          uStack_b0 = 0;
          pmVar3 = std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                 *)&local_58,(key_type_conflict1 *)&local_98);
          *pmVar3 = ABS(local_b8);
        }
        piVar5 = (rt->scaled).A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      piVar5 = (rt->scaled).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = local_98._M_impl._0_4_;
      for (lVar9 = (long)piVar5[(int)local_98._M_impl._0_4_]; lVar9 < piVar5[(long)iVar6 + 1];
          lVar9 = lVar9 + 1) {
        if ((rt->scaled).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar9] == iVar6) {
          pmVar3 = std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                 *)&local_58,(key_type_conflict1 *)&local_98);
          local_b8 = *pmVar3;
          local_68 = (rt->scaled).Q.mat.value.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar9];
          uStack_60 = 0;
          pmVar3 = std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                 *)&local_58,(key_type_conflict1 *)&local_98);
          dVar10 = fmax(local_b8,SQRT(ABS(local_68)));
          *pmVar3 = dVar10;
          piVar5 = (rt->scaled).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar6 = local_98._M_impl._0_4_;
        }
      }
      iVar2 = (rt->scaled).num_var;
      local_98._M_impl._0_4_ = iVar6 + 1;
    }
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    for (local_bc = 0; (int)local_bc < iVar2; local_bc = local_bc + 1) {
      pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_58,(key_type_conflict1 *)&local_bc);
      log2(*pmVar3);
      pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_98,(key_type_conflict1 *)&local_bc);
      *pmVar3 = 1.0;
      iVar2 = (rt->scaled).num_var;
    }
    lVar9 = 0;
    while (local_bc = (uint)lVar9, (int)local_bc < iVar2) {
      pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_98,(key_type_conflict1 *)&local_bc);
      dVar10 = *pmVar3;
      lVar4 = (long)(int)local_bc;
      piVar5 = (rt->scaled).A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1 = (rt->scaled).A.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = lVar4 + 1;
      iVar2 = piVar5[lVar4 + 1];
      for (lVar8 = (long)piVar5[lVar4]; lVar8 < iVar2; lVar8 = lVar8 + 1) {
        pdVar1[lVar8] = pdVar1[lVar8] / dVar10;
      }
      pdVar1 = (rt->scaled).c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1[lVar4] = pdVar1[lVar4] / dVar10;
      iVar2 = (rt->scaled).num_var;
    }
    local_bc = 0;
    while ((int)local_bc < iVar2) {
      pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_98,(key_type_conflict1 *)&local_bc);
      local_b8 = *pmVar3;
      uVar7 = (ulong)(int)local_bc;
      piVar5 = (rt->scaled).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar9 = (long)piVar5[uVar7]; lVar9 < piVar5[(long)(int)uVar7 + 1]; lVar9 = lVar9 + 1) {
        local_9c = (rt->scaled).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9];
        pmVar3 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_98,&local_9c);
        pdVar1 = (rt->scaled).Q.mat.value.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar1[lVar9] = pdVar1[lVar9] / (*pmVar3 * local_b8);
        uVar7 = (ulong)local_bc;
        piVar5 = (rt->scaled).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      iVar2 = (rt->scaled).num_var;
      local_bc = (int)uVar7 + 1;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&local_98);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&local_58);
  }
  scale_rows(rt);
  return;
}

Assistant:

void scale(Runtime& rt) {
  rt.scaled = rt.instance;
  scale_rows(rt);
  scale_cols(rt);
  scale_rows(rt);
}